

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O0

void __thiscall
QThreadPoolPrivate::stealAndRunRunnable(QThreadPoolPrivate *this,QRunnable *runnable)

{
  bool bVar1;
  QRunnable *in_RSI;
  QThreadPoolPrivate *in_RDI;
  bool del;
  QThreadPool *q;
  QRunnable *in_stack_00000028;
  QThreadPool *in_stack_00000030;
  
  q_func(in_RDI);
  bVar1 = QThreadPool::tryTake(in_stack_00000030,in_stack_00000028);
  if (bVar1) {
    bVar1 = QRunnable::autoDelete(in_RSI);
    (**in_RSI->_vptr_QRunnable)();
    if ((bVar1) && (in_RSI != (QRunnable *)0x0)) {
      (*in_RSI->_vptr_QRunnable[2])();
    }
  }
  return;
}

Assistant:

void QThreadPoolPrivate::stealAndRunRunnable(QRunnable *runnable)
{
    Q_Q(QThreadPool);
    if (!q->tryTake(runnable))
        return;
    // If autoDelete() is false, runnable might already be deleted after run(), so check status now.
    const bool del = runnable->autoDelete();

    runnable->run();

    if (del)
        delete runnable;
}